

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O0

int __thiscall
PoolList<Future<void>::Private::ThreadPool::ThreadContext>::remove
          (PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this,char *__filename)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *item;
  ThreadContext *value_local;
  PoolList<Future<void>::Private::ThreadPool::ThreadContext> *this_local;
  
  pIVar3 = (Item *)(__filename + -0x10);
  if (pIVar3->prev == (Item *)0x0) {
    pIVar1 = *(Item **)(__filename + -8);
    (this->_begin).item = pIVar1;
    pIVar1->prev = (Item *)0x0;
  }
  else {
    pIVar1 = pIVar3->prev;
    pIVar2 = *(Item **)(__filename + -8);
    pIVar3->prev->next = pIVar2;
    pIVar2->prev = pIVar1;
  }
  this->_size = this->_size - 1;
  Future<void>::Private::ThreadPool::ThreadContext::~ThreadContext((ThreadContext *)__filename);
  pIVar3->prev = this->freeItem;
  this->freeItem = pIVar3;
  return (int)this;
}

Assistant:

void remove(const T& value)
  {
    Item* item = (Item*)&value - 1;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    ((T*)(item + 1))->~T();
    item->prev = freeItem;
    freeItem = item;
  }